

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

Token * __thiscall pfederc::Lexer::next(Lexer *this)

{
  iterator __position;
  Token *pTVar1;
  bool bVar2;
  unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> result;
  Token *local_20;
  
  if (this->currentToken == (Token *)0x0) {
    local_20 = (Token *)0x0;
    __position._M_current =
         (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&this->lineIndices,__position,(unsigned_long *)&stack0xffffffffffffffe0);
    }
    else {
      *__position._M_current = 0;
      (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    nextChar(this);
    this->currentEndIndex = 0;
  }
  else {
    bVar2 = Token::operator==(this->currentToken,TOK_EOF);
    if (bVar2) {
      return this->currentToken;
    }
  }
  nextToken((Lexer *)&stack0xffffffffffffffe0);
  pTVar1 = local_20;
  this->currentToken = local_20;
  std::
  vector<std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>,std::allocator<std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>>>
  ::emplace_back<std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>>
            ((vector<std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>,std::allocator<std::unique_ptr<pfederc::Token,std::default_delete<pfederc::Token>>>>
              *)&this->tokens,
             (unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)
             &stack0xffffffffffffffe0);
  if (local_20 != (Token *)0x0) {
    (*local_20->_vptr_Token[1])();
  }
  return pTVar1;
}

Assistant:

Token& Lexer::next() noexcept {
  if  (!currentToken) {
    lineIndices.push_back(0);
    nextChar();
    currentEndIndex = 0;
  } else if (*currentToken == TokenType::TOK_EOF)
    return *currentToken;


  std::unique_ptr<Token> result(nextToken());
  Token &tok = *result;
  currentToken = result.get();
  tokens.push_back(std::move(result));
  return tok;
}